

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  FaceBase *face;
  FaceBase *face_00;
  BlueFaceDecorator *this;
  BlueFaceDecorator *this_00;
  
  face = (FaceBase *)operator_new(0x10);
  SmileFace::SmileFace((SmileFace *)face);
  face_00 = (FaceBase *)operator_new(0x10);
  UnhappyFace::UnhappyFace((UnhappyFace *)face_00);
  this = (BlueFaceDecorator *)operator_new(0x18);
  BlueFaceDecorator::BlueFaceDecorator(this,face);
  this_00 = (BlueFaceDecorator *)operator_new(0x18);
  BlueFaceDecorator::BlueFaceDecorator(this_00,face_00);
  (*face->_vptr_FaceBase[2])(face);
  (*face_00->_vptr_FaceBase[2])(face_00);
  (*(this->super_FaceBase)._vptr_FaceBase[2])(this);
  (*(this_00->super_FaceBase)._vptr_FaceBase[2])(this_00);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	FaceBase *smile = new SmileFace();
	FaceBase *unhappy = new UnhappyFace();

	BlueFaceDecorator *d1 = new BlueFaceDecorator(smile);
	BlueFaceDecorator *d2 = new BlueFaceDecorator(unhappy);

	smile->showFace();
	unhappy->showFace();
	d1->showFace();
	d2->showFace();

	return 0;
}